

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes2TestPackage.cpp
# Opt level: O0

void __thiscall deqp::gles2::TestCaseWrapper::deinit(TestCaseWrapper *this,TestCase *testCase)

{
  Context *pCVar1;
  RenderContext *renderCtx;
  ContextInfo *ctxInfo;
  TestCase *testCase_local;
  TestCaseWrapper *this_local;
  
  (*(testCase->super_TestNode)._vptr_TestNode[3])();
  pCVar1 = TestPackage::getContext(this->m_testPackage);
  renderCtx = Context::getRenderContext(pCVar1);
  pCVar1 = TestPackage::getContext(this->m_testPackage);
  ctxInfo = Context::getContextInfo(pCVar1);
  glu::resetState(renderCtx,ctxInfo);
  return;
}

Assistant:

void TestCaseWrapper::deinit (tcu::TestCase* testCase)
{
	testCase->deinit();

	DE_ASSERT(m_testPackage.getContext());
	glu::resetState(m_testPackage.getContext()->getRenderContext(), m_testPackage.getContext()->getContextInfo());
}